

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::ShaderDepthRangeTest::iterate(ShaderDepthRangeTest *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  IterateResult IVar2;
  undefined4 extraout_var;
  MessageBuilder *pMVar3;
  DepthRangeParams local_1b8 [3];
  MessageBuilder local_1a0;
  
  iVar1 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  local_1b8[0].zNear = 0.0;
  local_1b8[0].zFar = 1.0;
  local_1b8[1].zNear = 1.5;
  local_1b8[1].zFar = -1.0;
  local_1b8[2].zNear = 0.7;
  local_1b8[2].zFar = 0.3;
  this->m_depthRange = local_1b8[this->m_iterNdx];
  local_1a0.m_log = ((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"glDepthRangef(");
  pMVar3 = tcu::MessageBuilder::operator<<(&local_1a0,&(this->m_depthRange).zNear);
  std::operator<<((ostream *)&pMVar3->m_str,", ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&(this->m_depthRange).zFar);
  std::operator<<((ostream *)&pMVar3->m_str,")");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x4d8))
            ((this->m_depthRange).zNear,(this->m_depthRange).zFar);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glDepthRangef()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                  ,0x10c);
  deqp::gls::ShaderRenderCase::iterate(&this->super_ShaderRenderCase);
  iVar1 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar1;
  IVar2 = STOP;
  if (iVar1 != 3) {
    IVar2 = (IterateResult)
            (((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx)->m_testResult
            == QP_TEST_RESULT_PASS);
  }
  return IVar2;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions& gl = m_renderCtx.getFunctions();

		const DepthRangeParams cases[] =
		{
			DepthRangeParams(0.0f,  1.0f),
			DepthRangeParams(1.5f, -1.0f),
			DepthRangeParams(0.7f,  0.3f)
		};

		m_depthRange = cases[m_iterNdx];
		m_testCtx.getLog() << tcu::TestLog::Message << "glDepthRangef(" << m_depthRange.zNear << ", " << m_depthRange.zFar << ")" << tcu::TestLog::EndMessage;
		gl.depthRangef(m_depthRange.zNear, m_depthRange.zFar);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDepthRangef()");

		gls::ShaderRenderCase::iterate();
		m_iterNdx += 1;

		if (m_iterNdx == DE_LENGTH_OF_ARRAY(cases) || m_testCtx.getTestResult() != QP_TEST_RESULT_PASS)
			return STOP;
		else
			return CONTINUE;
	}